

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O2

size_t __thiscall
tsl::rh::power_of_two_growth_policy<2UL>::next_bucket_count(power_of_two_growth_policy<2UL> *this)

{
  length_error *this_00;
  
  if (0xbffffffffffffffe < this->m_mask + 0xc000000000000000) {
    return this->m_mask * 2 + 2;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"The hash table exceeds its maxmimum size.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

std::size_t next_bucket_count() const {
        if((m_mask + 1) > max_bucket_count() / GrowthFactor) {
            throw std::length_error("The hash table exceeds its maxmimum size.");
        }
        
        return (m_mask + 1) * GrowthFactor;
    }